

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::utility::operator<<
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,
          io_range<const_unsigned_long_*> *IO_range)

{
  bool bVar1;
  undefined8 *in_RSI;
  wostream *in_RDI;
  bool bVar2;
  unsigned_long *pos;
  ulong *local_18;
  
  local_18 = (ulong *)*in_RSI;
  while( true ) {
    bVar1 = std::wios::operator_cast_to_bool((wios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    bVar2 = false;
    if (bVar1) {
      bVar2 = local_18 != (ulong *)in_RSI[1];
    }
    if (!bVar2) break;
    std::wostream::operator<<(in_RDI,*local_18);
    local_18 = local_18 + 1;
    if ((local_18 != (ulong *)in_RSI[1]) && (in_RSI[2] != 0)) {
      std::operator<<(in_RDI,(char *)in_RSI[2]);
    }
  }
  return (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (out and pos != IO_range.last) {
        out << (*pos);
        ++pos;
        if (pos != IO_range.last and IO_range.delim_str != 0)
          out << IO_range.delim_str;
      }
      return out;
    }